

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O1

void __thiscall pg::PPSolver::run(PPSolver *this)

{
  Game *pGVar1;
  uint64_t *puVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer piVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  int *piVar12;
  int *__s;
  int *piVar13;
  ostream *poVar14;
  uint p;
  long lVar15;
  uint i;
  ulong uVar16;
  pointer *ppiVar17;
  int iVar18;
  
  pGVar1 = (this->super_Solver).game;
  iVar18 = *(int *)((long)pGVar1->_priority + ((pGVar1->n_vertices << 0x20) + -0x100000000 >> 0x1e))
  ;
  uVar16 = (ulong)(iVar18 + 1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar16;
  uVar9 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar10 = uVar9 + 8;
  if (0xfffffffffffffff7 < uVar9) {
    uVar10 = 0xffffffffffffffff;
  }
  this->max_prio = iVar18;
  if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar11 = (ulong *)operator_new__(uVar10);
  *puVar11 = uVar16;
  if (iVar18 != -1) {
    memset((vector<int,_std::allocator<int>_> *)(puVar11 + 1),0,
           ((uVar16 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  this->regions = (vector<int,_std::allocator<int>_> *)(puVar11 + 1);
  piVar12 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                  pGVar1->n_vertices << 2);
  this->region = piVar12;
  __s = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                              pGVar1->n_vertices << 2);
  this->strategy = __s;
  uVar16 = uVar16 << 2;
  if (iVar18 < -1) {
    uVar16 = 0xffffffffffffffff;
  }
  piVar13 = (int *)operator_new__(uVar16);
  this->inverse = piVar13;
  uVar9 = pGVar1->n_vertices;
  if (0 < (long)uVar9) {
    puVar2 = ((this->super_Solver).disabled)->_bits;
    uVar10 = 0;
    do {
      iVar18 = -2;
      if ((puVar2[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) {
        iVar18 = pGVar1->_priority[uVar10];
      }
      piVar12[uVar10] = iVar18;
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  if (0 < (long)uVar9) {
    memset(__s,0xff,uVar9 * 4);
  }
  uVar9 = (ulong)((int)uVar9 - 1);
  this->promotions = 0;
  do {
    if ((int)uVar9 < 0) break;
    piVar12 = ((this->super_Solver).game)->_priority;
    p = piVar12[uVar9];
    do {
      i = (uint)uVar9;
      if ((piVar12[uVar9] != p) ||
         (((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0 &&
          (this->region[uVar9] <= (int)p)))) goto LAB_0015c982;
      uVar9 = (ulong)(i - 1);
    } while (0 < (int)i);
    i = 0xffffffff;
LAB_0015c982:
    uVar9 = 0xffffffff;
    if (-1 < (int)i) {
      if (piVar12[i] == p) {
        this->inverse[(int)p] = i;
        bVar7 = setupRegion(this,i,p,true);
        if (bVar7) {
          uVar9 = (ulong)i;
          do {
            if (1 < (this->super_Solver).trace) {
              reportRegion(this,p);
            }
            uVar8 = (*(this->super_Solver)._vptr_Solver[4])(this,uVar9,(ulong)p);
            if (uVar8 == 0xffffffff) {
              setDominion(this,p);
              uVar9 = (ulong)((int)((this->super_Solver).game)->n_vertices - 1);
LAB_0015ca2a:
              bVar7 = false;
            }
            else {
              if (uVar8 == 0xfffffffe) {
                if (-1 < (int)uVar9) {
                  do {
                    iVar18 = (int)uVar9;
                    if (((this->super_Solver).game)->_priority[uVar9] != p) goto LAB_0015ca2a;
                    uVar9 = (ulong)(iVar18 - 1);
                  } while (0 < iVar18);
                  uVar9 = 0xffffffff;
                }
                goto LAB_0015ca2a;
              }
              promote(this,p,uVar8);
              uVar9 = (ulong)(uint)this->inverse[(int)uVar8];
              bVar7 = true;
              p = uVar8;
            }
          } while (bVar7);
        }
        else {
          uVar8 = i;
          do {
            uVar9 = (ulong)uVar8;
            if (((this->super_Solver).game)->_priority[uVar8] != p) break;
            bVar7 = 0 < (int)uVar8;
            uVar9 = 0xffffffff;
            uVar8 = uVar8 - 1;
          } while (bVar7);
        }
      }
      else {
        uVar9 = (ulong)i;
        if (this->regions[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            this->regions[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          resetRegion(this,p);
          uVar9 = (ulong)i;
        }
      }
    }
  } while (-1 < (int)i);
  pvVar3 = this->regions;
  if (pvVar3 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar4 = pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppiVar17 = &pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar4 != (pointer)0x0) {
      lVar15 = (long)piVar4 * 0x18;
      do {
        pvVar5 = *(void **)((long)&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar15);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,*(long *)((long)ppiVar17 + lVar15) - (long)pvVar5);
        }
        lVar15 = lVar15 + -0x18;
      } while (lVar15 != 0);
    }
    operator_delete__(ppiVar17,(long)piVar4 * 0x18 + 8);
  }
  if (this->region != (int *)0x0) {
    operator_delete__(this->region);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->inverse != (int *)0x0) {
    operator_delete__(this->inverse);
  }
  poVar14 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"solved with ",0xc);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->promotions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," promotions.",0xc);
  std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  return;
}

Assistant:

void
PPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // PP: always reset region
        if (setupRegion(i, p, true)) {
            // region not empty, maybe promote
            while (true) {
#ifndef NDEBUG
                if (trace >= 2) reportRegion(p);
#endif
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    break;
                } else {
                    // found promotion, promote
                    promote(p, res);
                    // continue inner loop with the higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}